

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O0

int stdio_over_pipes_helper(void)

{
  char *base;
  uv_handle_type uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  size_t sVar4;
  uv_buf_t uVar5;
  char *local_618;
  char *local_610;
  uv_loop_t *loop;
  int r;
  uint i;
  uv_buf_t buf [7];
  uv_write_t write_req [7];
  char *buffers [7];
  
  memcpy(&write_req[6].bufsml[3].len,&DAT_001dad70,0x38);
  puVar3 = uv_default_loop();
  uVar1 = uv_guess_handle(0);
  if (uVar1 != UV_NAMED_PIPE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xd2,"UV_NAMED_PIPE == uv_guess_handle(0)");
    abort();
  }
  uVar1 = uv_guess_handle(1);
  if (uVar1 != UV_NAMED_PIPE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xd3,"UV_NAMED_PIPE == uv_guess_handle(1)");
    abort();
  }
  iVar2 = uv_pipe_init(puVar3,&stdin_pipe,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xd6,"r == 0");
    abort();
  }
  iVar2 = uv_pipe_init(puVar3,&stdout_pipe,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xd8,"r == 0");
    abort();
  }
  uv_pipe_open(&stdin_pipe,0);
  uv_pipe_open(&stdout_pipe,1);
  uv_unref((uv_handle_t *)&stdin_pipe);
  uv_unref((uv_handle_t *)&stdout_pipe);
  for (loop._4_4_ = 0; loop._4_4_ < 7; loop._4_4_ = loop._4_4_ + 1) {
    base = buffers[(ulong)loop._4_4_ - 1];
    sVar4 = strlen(buffers[(ulong)loop._4_4_ - 1]);
    uVar5 = uv_buf_init(base,(uint)sVar4);
    local_618 = uVar5.base;
    *(char **)(&r + (ulong)loop._4_4_ * 4) = local_618;
    local_610 = (char *)uVar5.len;
    buf[loop._4_4_].base = local_610;
  }
  for (loop._4_4_ = 0; loop._4_4_ < 7; loop._4_4_ = loop._4_4_ + 1) {
    iVar2 = uv_write((uv_write_t *)&write_req[(ulong)loop._4_4_ - 1].bufsml[3].len,
                     (uv_stream_t *)&stdout_pipe,(uv_buf_t *)(&r + (ulong)loop._4_4_ * 4),1,
                     after_pipe_write);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
              ,0xe8,"r == 0");
      abort();
    }
  }
  notify_parent_process();
  uv_run(puVar3,UV_RUN_DEFAULT);
  if (after_write_called != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xee,"after_write_called == 7");
    abort();
  }
  if (on_pipe_read_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xef,"on_pipe_read_called == 0");
    abort();
  }
  if (close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xf0,"close_cb_called == 0");
    abort();
  }
  uv_ref((uv_handle_t *)&stdout_pipe);
  uv_ref((uv_handle_t *)&stdin_pipe);
  iVar2 = uv_read_start((uv_stream_t *)&stdin_pipe,on_read_alloc,on_pipe_read);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xf6,"r == 0");
    abort();
  }
  uv_run(puVar3,UV_RUN_DEFAULT);
  if (after_write_called != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xfa,"after_write_called == 7");
    abort();
  }
  if (on_pipe_read_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xfb,"on_pipe_read_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xfc,"close_cb_called == 2");
    abort();
  }
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xfe,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

int stdio_over_pipes_helper(void) {
  /* Write several buffers to test that the write order is preserved. */
  char* buffers[] = {
    "he",
    "ll",
    "o ",
    "wo",
    "rl",
    "d",
    "\n"
  };

  uv_write_t write_req[ARRAY_SIZE(buffers)];
  uv_buf_t buf[ARRAY_SIZE(buffers)];
  unsigned int i;
  int r;
  uv_loop_t* loop = uv_default_loop();

  ASSERT(UV_NAMED_PIPE == uv_guess_handle(0));
  ASSERT(UV_NAMED_PIPE == uv_guess_handle(1));

  r = uv_pipe_init(loop, &stdin_pipe, 0);
  ASSERT(r == 0);
  r = uv_pipe_init(loop, &stdout_pipe, 0);
  ASSERT(r == 0);

  uv_pipe_open(&stdin_pipe, 0);
  uv_pipe_open(&stdout_pipe, 1);

  /* Unref both stdio handles to make sure that all writes complete. */
  uv_unref((uv_handle_t*)&stdin_pipe);
  uv_unref((uv_handle_t*)&stdout_pipe);

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    buf[i] = uv_buf_init((char*)buffers[i], strlen(buffers[i]));
  }

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    r = uv_write(&write_req[i], (uv_stream_t*)&stdout_pipe, &buf[i], 1,
      after_pipe_write);
    ASSERT(r == 0);
  }

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 0);
  ASSERT(close_cb_called == 0);

  uv_ref((uv_handle_t*)&stdout_pipe);
  uv_ref((uv_handle_t*)&stdin_pipe);

  r = uv_read_start((uv_stream_t*)&stdin_pipe, on_read_alloc, on_pipe_read);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}